

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QtPrivate::QModelIndexWrapper,QSortFilterProxyModelPrivate::Mapping*>::
emplace_helper<QSortFilterProxyModelPrivate::Mapping*>
          (QHash<QtPrivate::QModelIndexWrapper,QSortFilterProxyModelPrivate::Mapping*> *this,
          QModelIndexWrapper *key,Mapping **args)

{
  Entry *pEVar1;
  byte bVar2;
  Entry *pEVar3;
  ulong uVar4;
  int iVar5;
  undefined4 uVar6;
  piter pVar7;
  quintptr qVar8;
  long lVar9;
  Mapping *pMVar10;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::
  Data<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>
  ::findOrInsert<QtPrivate::QModelIndexWrapper>
            ((InsertionResult *)local_38,
             *(Data<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>
               **)this,key);
  pEVar3 = (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries;
  bVar2 = (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
          [(uint)local_38._8_8_ & 0x7f];
  if (local_38[0x10] == false) {
    uVar4 = (ulong)bVar2;
    lVar9 = uVar4 * 0x20;
    *(QAbstractItemModel **)(pEVar3[uVar4].storage.data + 0x10) = (key->index).m.ptr;
    iVar5 = (key->index).c;
    qVar8 = (key->index).i;
    uVar6 = *(undefined4 *)((long)&(key->index).i + 4);
    pEVar1 = pEVar3 + uVar4;
    *(int *)(pEVar1->storage).data = (key->index).r;
    *(int *)((pEVar1->storage).data + 4) = iVar5;
    *(int *)((pEVar1->storage).data + 8) = (int)qVar8;
    *(undefined4 *)((pEVar1->storage).data + 0xc) = uVar6;
    pMVar10 = *args;
  }
  else {
    pMVar10 = *args;
    lVar9 = (ulong)bVar2 << 5;
  }
  *(Mapping **)((pEVar3->storage).data + lVar9 + 0x18) = pMVar10;
  pVar7.bucket = local_38._8_8_;
  pVar7.d = (Data<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>
             *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar7;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }